

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O0

void __thiscall BuildTest::~BuildTest(BuildTest *this)

{
  BuildTest *this_local;
  
  (this->super_StateTestWithBuiltinRules).super_Test._vptr_Test =
       (_func_int **)&PTR__BuildTest_002a37f8;
  (this->super_BuildLogUser)._vptr_BuildLogUser = (_func_int **)&DAT_002a3838;
  std::unique_ptr<CommandRunner,_std::default_delete<CommandRunner>_>::release
            (&(this->builder_).command_runner_);
  Builder::~Builder(&this->builder_);
  StatusPrinter::~StatusPrinter(&this->status_);
  VirtualFileSystem::~VirtualFileSystem(&this->fs_);
  FakeCommandRunner::~FakeCommandRunner(&this->command_runner_);
  StateTestWithBuiltinRules::~StateTestWithBuiltinRules(&this->super_StateTestWithBuiltinRules);
  return;
}

Assistant:

~BuildTest() {
    builder_.command_runner_.release();
  }